

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O3

size_t obj_desc_name_format(char *buf,size_t max,size_t end,char *fmt,char *modstr,_Bool pluralise)

{
  byte bVar1;
  char *pcVar2;
  byte *__s;
  uint uVar3;
  undefined7 in_register_00000089;
  byte *pbVar4;
  size_t local_48;
  uint local_40;
  undefined4 local_3c;
  char *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,pluralise);
  uVar3 = (uint)pluralise;
  local_48 = end;
  do {
    bVar1 = *fmt;
    while (bVar1 == 0x26) {
      while ((bVar1 == 0x26 || (bVar1 == 0x20))) {
        pbVar4 = (byte *)fmt + 1;
        fmt = (char *)((byte *)fmt + 1);
        bVar1 = *pbVar4;
      }
    }
    if (bVar1 < 0x7c) {
      if (bVar1 == 0) {
        buf[local_48] = '\0';
        return local_48;
      }
      if (bVar1 == 0x23) {
        local_48 = obj_desc_name_format(buf,max,local_48,modstr,(char *)0x0,SUB41(uVar3,0));
      }
      else {
LAB_0018967f:
        buf[local_48] = bVar1;
        local_48 = local_48 + 1;
      }
    }
    else if (bVar1 == 0x7c) {
      pbVar4 = (byte *)fmt + 1;
      local_40 = uVar3;
      local_38 = modstr;
      pcVar2 = strchr((char *)pbVar4,0x7c);
      if (pcVar2 == (char *)0x0) {
        return local_48;
      }
      __s = (byte *)(pcVar2 + 1);
      fmt = strchr((char *)__s,0x7c);
      if ((byte *)fmt == (byte *)0x0) {
        return local_48;
      }
      if ((char)local_3c == '\0') {
        uVar3 = ~(uint)pbVar4 + (int)__s;
      }
      else {
        uVar3 = (int)fmt - (int)__s;
        pbVar4 = __s;
      }
      strnfcat(buf,max,&local_48,"%.*s",(ulong)uVar3,pbVar4);
      modstr = local_38;
      uVar3 = local_40;
    }
    else {
      if (bVar1 != 0x7e) goto LAB_0018967f;
      if ((char)local_3c != '\0') {
        if ((((byte *)fmt)[-1] - 0x68 < 0x11) &&
           ((0x10801U >> (((byte *)fmt)[-1] - 0x68 & 0x1f) & 1) != 0)) {
          pcVar2 = "es";
        }
        else {
          pcVar2 = "s";
        }
        strnfcat(buf,max,&local_48,pcVar2);
      }
    }
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

size_t obj_desc_name_format(char *buf, size_t max, size_t end,
		const char *fmt, const char *modstr, bool pluralise)
{
	/* Copy the string */
	while (*fmt) {
		/* Skip */
		if (*fmt == '&') {
			while (*fmt == ' ' || *fmt == '&')
				fmt++;
			continue;
		} else if (*fmt == '~') {
			/* Pluralizer (regular English plurals) */
			char prev = *(fmt - 1);

			if (!pluralise)	{
				fmt++;
				continue;
			}

			/* e.g. cutlass-e-s, torch-e-s, box-e-s */
			if (prev == 's' || prev == 'h' || prev == 'x')
				strnfcat(buf, max, &end, "es");
			else
				strnfcat(buf, max, &end, "s");
		} else if (*fmt == '|') {
			/* Special plurals 
			* e.g. kni|fe|ves|
			*          ^  ^  ^ */
			const char *singular = fmt + 1;
			const char *plural   = strchr(singular, '|');
			const char *endmark  = NULL;

			if (plural) {
				plural++;
				endmark = strchr(plural, '|');
			}

			if (!singular || !plural || !endmark) return end;

			if (!pluralise)
				strnfcat(buf, max, &end, "%.*s",
					(int) (plural - singular) - 1,
					singular);
			else
				strnfcat(buf, max, &end, "%.*s",
					(int) (endmark - plural), plural);

			fmt = endmark;
		} else if (*fmt == '#') {
			/* Add modstr, with pluralisation if relevant */
			end = obj_desc_name_format(buf, max, end, modstr, NULL,	pluralise);
		}

		else
			buf[end++] = *fmt;

		fmt++;
	}

	buf[end] = 0;

	return end;
}